

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::DFARoutineEM64T<unsigned_char>::emit
               (X86Assembler *as,Label *rejectlabel,DFA<unsigned_char> *dfa,MyConstPool *pool)

{
  int iVar1;
  int o1;
  reference pvVar2;
  undefined4 in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  CodeEmitter *in_stack_fffffffffffffee0;
  DFAState<unsigned_char> *in_stack_fffffffffffffee8;
  uint32_t instId;
  CodeEmitter *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  Operand_ *in_stack_ffffffffffffff00;
  X86Assembler *o0;
  uint32_t instId_00;
  undefined4 in_stack_ffffffffffffff14;
  int iVar3;
  int index;
  undefined1 local_e8 [4];
  int i_1;
  Label finishlabel;
  uint32_t local_b4;
  undefined1 local_b0 [4];
  int i;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  MyConstPool *pool_local;
  DFA<unsigned_char> *dfa_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pool;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0);
  local_b4 = 0;
  while( true ) {
    instId_00 = local_b4;
    iVar1 = NFABase<Centaurus::DFAState<unsigned_char>_>::get_state_num
                      (&dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>);
    if (iVar1 <= (int)instId_00) break;
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
              ((undefined1 *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8));
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0,
               (value_type *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8));
    local_b4 = local_b4 + 1;
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_e8);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_ffffffffffffff14,iVar1),instId_00,
             in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  o0 = as;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0,0);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(Operand_ *)0x158849);
  iVar3 = 0;
  while( true ) {
    instId = (uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    index = iVar3;
    o1 = NFABase<Centaurus::DFAState<unsigned_char>_>::get_state_num
                   (&dfa->super_NFABase<Centaurus::DFAState<unsigned_char>_>);
    if (o1 <= iVar3) break;
    in_stack_fffffffffffffef0 = (CodeEmitter *)as;
    pvVar2 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0,
                        (long)index);
    (*(((Assembler *)&in_stack_fffffffffffffef0->_vptr_CodeEmitter)->super_CodeEmitter).
      _vptr_CodeEmitter[9])(in_stack_fffffffffffffef0,pvVar2);
    in_stack_fffffffffffffee0 = (CodeEmitter *)as;
    in_stack_fffffffffffffee8 = DFA<unsigned_char>::operator[](dfa,index);
    emit_state((X86Assembler *)in_stack_fffffffffffffee0,(Label *)local_e8,in_stack_fffffffffffffee8
               ,index,(vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0,
               (MyConstPool *)
               statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    iVar3 = index + 1;
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,local_e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffef0,instId,(Operand_ *)in_stack_fffffffffffffee0,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  asmjit::CodeEmitter::emit((CodeEmitter *)CONCAT44(index,iVar1),instId_00,(Operand_ *)o0,o1);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,(Operand_ *)0x1589e2);
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_b0);
  return;
}

Assistant:

void DFARoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const DFA<TCHAR>& dfa, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    asmjit::Label finishlabel = as.newLabel();

    as.mov(BACKUP_REG, 0);
    as.jmp(statelabels[0]);

    for (int i = 0; i < dfa.get_state_num(); i++)
    {
        as.bind(statelabels[i]);

        emit_state(as, finishlabel, dfa[i], i, statelabels, pool);
    }
    as.bind(finishlabel);
    as.mov(INPUT_REG, BACKUP_REG);
    as.cmp(INPUT_REG, 0);
    as.jz(rejectlabel);
}